

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::Segment::DoParseNext(Segment *this,Cluster **pResult,longlong *pos,long *len)

{
  Cluster **ppCVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  longlong lVar5;
  longlong lVar6;
  ulong uVar7;
  Cues *this_00;
  Cluster **ppCVar8;
  Cluster *pCVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  Cluster **ppCVar14;
  long lVar15;
  longlong avail;
  longlong total;
  long len_;
  longlong pos_;
  long local_68;
  long *local_60;
  long local_58;
  long local_50;
  Cluster **local_48;
  long local_40;
  long local_38;
  
  iVar4 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_50,&local_68);
  if (iVar4 < 0) {
    return (long)iVar4;
  }
  lVar15 = this->m_start + this->m_size;
  if (this->m_size < 0) {
    lVar15 = -1;
  }
  lVar12 = *pos;
  local_48 = pResult;
  if (local_50 <= lVar12 && -1 < local_50) {
    return 1;
  }
LAB_00157e53:
  if ((-1 < lVar15) && (lVar15 <= lVar12)) {
    return 1;
  }
  if (local_68 <= lVar12) goto LAB_00158468;
  lVar5 = GetUIntLength(this->m_pReader,lVar12,len);
  if (lVar5 < 0) {
    return lVar5;
  }
  if (lVar5 != 0) {
    return -3;
  }
  local_58 = *pos;
  if (-1 < lVar15 && lVar15 < *len + local_58) {
    return -2;
  }
  if (local_68 < *len + local_58) {
    return -3;
  }
  lVar10 = this->m_start;
  lVar5 = ReadID(this->m_pReader,local_58,len);
  if (lVar5 < 0) {
    return lVar5;
  }
  if (lVar5 == 0) {
    return -1;
  }
  lVar12 = *pos + *len;
  *pos = lVar12;
  if (local_68 <= lVar12) {
    *len = 1;
    return -3;
  }
  lVar6 = GetUIntLength(this->m_pReader,lVar12,len);
  if (lVar6 < 0) {
    return lVar6;
  }
  if (lVar6 != 0) {
    return -3;
  }
  lVar12 = *len + *pos;
  if (-1 < lVar15 && lVar15 < lVar12) {
    return -2;
  }
  if (local_68 < lVar12) {
    return -3;
  }
  uVar7 = ReadUInt(this->m_pReader,*pos,len);
  if ((long)uVar7 < 0) {
    return uVar7;
  }
  lVar13 = *len;
  lVar12 = *pos + lVar13;
  *pos = lVar12;
  if (uVar7 == 0) goto LAB_001580bd;
  uVar11 = -1L << ((char)lVar13 * '\a' & 0x3fU) ^ uVar7;
  lVar13 = uVar7 + lVar12;
  if (((-1 < lVar15) && (uVar11 != 0xffffffffffffffff)) && (lVar15 < lVar13)) {
    return -2;
  }
  local_60 = pos;
  if (lVar5 == 0x1c53bb6b) {
    if (uVar11 == 0xffffffffffffffff) {
      return -2;
    }
    if (-1 < lVar15 && lVar15 < lVar13) {
      return -2;
    }
    if (this->m_pCues == (Cues *)0x0) {
      this_00 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
      pos = local_60;
      if (this_00 == (Cues *)0x0) {
        this->m_pCues = (Cues *)0x0;
        return 0;
      }
      Cues::Cues(this_00,this,lVar12,uVar7,local_58,lVar13 - local_58);
      this->m_pCues = this_00;
      lVar13 = *pos + uVar7;
    }
    *pos = lVar13;
    lVar12 = lVar13;
  }
  else {
    if (lVar5 == 0x1f43b675) {
      local_58 = local_58 - lVar10;
      ppCVar14 = this->m_clusters + this->m_clusterCount;
      if (0 < this->m_clusterPreloadCount) {
        ppCVar8 = ppCVar14 + this->m_clusterPreloadCount;
        do {
          ppCVar1 = (Cluster **)
                    ((long)ppCVar14 +
                    (((long)ppCVar8 - (long)ppCVar14 >> 3) -
                     ((long)ppCVar8 - (long)ppCVar14 >> 0x3f) & 0xfffffffffffffffeU) * 4);
          pCVar9 = *ppCVar1;
          lVar12 = pCVar9->m_element_start - pCVar9->m_pSegment->m_start;
          *pos = lVar12;
          if (lVar12 < local_58) {
            ppCVar14 = ppCVar1 + 1;
          }
          else {
            ppCVar8 = ppCVar1;
            if (lVar12 <= local_58) {
              *local_48 = pCVar9;
              return 0;
            }
          }
        } while (ppCVar14 < ppCVar8);
      }
      lVar12 = Cluster::HasBlockEntries(this,local_58,&local_38,&local_40);
      plVar2 = local_60;
      if (lVar12 < 0) {
        *local_60 = local_38;
        *len = local_40;
        return lVar12;
      }
      if (lVar12 != 0) {
        pCVar9 = Cluster::Create(this,-1,local_58);
        if (pCVar9 == (Cluster *)0x0) {
          return -1;
        }
        bVar3 = PreloadCluster(this,pCVar9,(long)ppCVar14 - (long)this->m_clusters >> 3);
        if (!bVar3) {
          Cluster::~Cluster(pCVar9);
          operator_delete(pCVar9);
          return -1;
        }
        *local_48 = pCVar9;
        return 0;
      }
      lVar12 = *local_60;
      if (uVar11 != 0xffffffffffffffff) goto LAB_00158438;
      lVar10 = lVar12;
      if ((lVar12 < local_50 || local_50 < 0) && (lVar12 < lVar15 || lVar15 < 0)) {
        do {
          if (local_68 <= lVar10) {
LAB_00158468:
            *len = 1;
            return -3;
          }
          lVar5 = GetUIntLength(this->m_pReader,lVar10,len);
          if (lVar5 < 0) {
            return lVar5;
          }
          if (lVar5 != 0) {
            return -3;
          }
          lVar10 = *len + *plVar2;
          if (-1 < lVar15 && lVar15 < lVar10) {
            return -2;
          }
          if (local_68 < lVar10) {
            return -3;
          }
          lVar5 = ReadID(this->m_pReader,*plVar2,len);
          if (lVar5 < 0) {
            return lVar5;
          }
          if ((lVar5 == 0x1c53bb6b) || (lVar5 == 0x1f43b675)) goto LAB_0015842f;
          lVar10 = *plVar2 + *len;
          *plVar2 = lVar10;
          if (local_68 <= lVar10) {
            *len = 1;
            return -3;
          }
          lVar5 = GetUIntLength(this->m_pReader,lVar10,len);
          if (lVar5 < 0) {
            return lVar5;
          }
          if (lVar5 != 0) {
            return -3;
          }
          lVar10 = *len + *plVar2;
          if (-1 < lVar15 && lVar15 < lVar10) {
            return -2;
          }
          if (local_68 < lVar10) {
            return -3;
          }
          uVar7 = ReadUInt(this->m_pReader,*plVar2,len);
          if ((long)uVar7 < 0) {
            return uVar7;
          }
          lVar13 = *len;
          lVar10 = *plVar2 + lVar13;
          *plVar2 = lVar10;
          if (uVar7 != 0) {
            if ((-1L << ((char)lVar13 * '\a' & 0x3fU) ^ uVar7) == 0xffffffffffffffff) {
              return -2;
            }
            lVar10 = lVar10 + uVar7;
            if ((-1 < lVar15) && (lVar15 < lVar10)) {
              return -2;
            }
            *plVar2 = lVar10;
          }
          if ((local_50 <= lVar10 && -1 < local_50) || (lVar15 <= lVar10 && -1 < lVar15))
          goto LAB_0015842f;
        } while( true );
      }
      goto LAB_00158432;
    }
    if (uVar11 == 0xffffffffffffffff) {
      return -2;
    }
    *pos = lVar13;
    lVar12 = lVar13;
  }
  if ((-1 < lVar15) && (lVar15 < lVar12)) {
    return -2;
  }
LAB_001580bd:
  if ((-1 < local_50) && (local_50 <= lVar12)) {
    return 1;
  }
  goto LAB_00157e53;
LAB_0015842f:
  lVar10 = *plVar2;
LAB_00158432:
  uVar7 = lVar10 - lVar12;
  *plVar2 = lVar12;
LAB_00158438:
  *plVar2 = lVar12 + uVar7;
  return (ulong)((long)(lVar12 + uVar7) <= lVar15 || lVar15 < 0) * 4 + -2;
}

Assistant:

long Segment::DoParseNext(const Cluster*& pResult, long long& pos, long& len) {
  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // Parse next cluster.  This is strictly a parsing activity.
  // Creation of a new cluster object happens later, after the
  // parsing is done.

  long long off_next = 0;
  long long cluster_size = -1;

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return 1;  // EOF

    if ((segment_stop >= 0) && (pos >= segment_stop))
      return 1;  // EOF

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;  // absolute
    const long long idoff = pos - m_start;  // relative

    const long long id = ReadID(m_pReader, idpos, len);  // absolute

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // weird
      return -1;  // generic error

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      const long long element_stop = pos + size;

      if ((segment_stop >= 0) && (element_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      const long long element_start = idpos;
      const long long element_size = element_stop - element_start;

      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);
        if (m_pCues == NULL)
          return false;
      }

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    if (id != libwebm::kMkvCluster) {  // not a Cluster ID
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    // We have a cluster.
    off_next = idoff;

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  assert(off_next > 0);  // have cluster

  // We have parsed the next cluster.
  // We have not created a cluster object yet.  What we need
  // to do now is determine whether it has already be preloaded
  //(in which case, an object for this cluster has already been
  // created), and if not, create a new cluster object.

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    const Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    pos = pNext->GetPosition();
    assert(pos >= 0);

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else {
      pResult = pNext;
      return 0;  // success
    }
  }

  assert(i == j);

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, off_next, pos_, len_);

  if (status < 0) {  // error or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  if (status > 0) {  // means "found at least one block entry"
    Cluster* const pNext = Cluster::Create(this,
                                           -1,  // preloaded
                                           off_next);
    if (pNext == NULL)
      return -1;

    const ptrdiff_t idx_next = i - m_clusters;  // insertion position

    if (!PreloadCluster(pNext, idx_next)) {
      delete pNext;
      return -1;
    }
    assert(m_clusters);
    assert(idx_next < m_clusterSize);
    assert(m_clusters[idx_next] == pNext);

    pResult = pNext;
    return 0;  // success
  }

  // status == 0 means "no block entries found"

  if (cluster_size < 0) {  // unknown size
    const long long payload_pos = pos;  // absolute pos of cluster payload

    for (;;) {  // determine cluster size
      if ((total >= 0) && (pos >= total))
        break;

      if ((segment_stop >= 0) && (pos >= segment_stop))
        break;  // no more clusters

      // Read ID

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      long long result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long idpos = pos;
      const long long id = ReadID(m_pReader, idpos, len);

      if (id < 0)  // error (or underflow)
        return static_cast<long>(id);

      // This is the distinguished set of ID's we use to determine
      // that we have exhausted the sub-element's inside the cluster
      // whose ID we parsed earlier.

      if (id == libwebm::kMkvCluster || id == libwebm::kMkvCues)
        break;

      pos += len;  // consume ID (of sub-element)

      // Read Size

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long size = ReadUInt(m_pReader, pos, len);

      if (size < 0)  // error
        return static_cast<long>(size);

      pos += len;  // consume size field of element

      // pos now points to start of sub-element's payload

      if (size == 0)  // weird
        continue;

      const long long unknown_size = (1LL << (7 * len)) - 1;

      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;  // not allowed for sub-elements

      if ((segment_stop >= 0) && ((pos + size) > segment_stop))  // weird
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload of sub-element
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;
    }  // determine cluster size

    cluster_size = pos - payload_pos;
    assert(cluster_size >= 0);  // TODO: handle cluster_size = 0

    pos = payload_pos;  // reset and re-parse original cluster
  }

  pos += cluster_size;  // consume payload
  if (segment_stop >= 0 && pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  return 2;  // try to find a cluster that follows next
}